

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleserver.hpp
# Opt level: O3

Method SimpleServer::toMethod(string *method)

{
  int iVar1;
  Method MVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)method);
  if (iVar1 == 0) {
    MVar2 = GET;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)method);
    if (iVar1 == 0) {
      MVar2 = HEAD;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)method);
      if (iVar1 == 0) {
        MVar2 = POST;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)method);
        if (iVar1 == 0) {
          MVar2 = OPTIONS;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)method);
          if (iVar1 == 0) {
            MVar2 = CONNECT;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)method);
            if (iVar1 == 0) {
              MVar2 = TRACE;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)method);
              if (iVar1 == 0) {
                MVar2 = PUT;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)method);
                if (iVar1 == 0) {
                  MVar2 = PATCH;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)method);
                  MVar2 = DELETE;
                  if (iVar1 != 0) {
                    __assert_fail("false && \"INVALID METHOD\"",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/lapinozz[P]SimpleServer/example/../include/SimpleServer/simpleserver.hpp"
                                  ,0xf5,"Method SimpleServer::toMethod(std::string)");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return MVar2;
}

Assistant:

inline Method toMethod(std::string method)
	{
		if (method == "GET") return GET;
		else if (method == "HEAD") return HEAD;
		else if (method == "POST") return POST;
		else if (method == "OPTIONS") return OPTIONS;
		else if (method == "CONNECT") return CONNECT;
		else if (method == "TRACE") return TRACE;
		else if (method == "PUT") return PUT;
		else if (method == "PATCH") return PATCH;
		else if (method == "DELETE") return DELETE;

		assert(false && "INVALID METHOD");
	}